

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O3

bool __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
CheckEmptySubCon<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_2>>,mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_2>>>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>
                 *cc,
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
          *prepro)

{
  bool bVar1;
  bool bVar2;
  longdouble in_ST0;
  ulong uVar3;
  ulong uVar4;
  ptr local_48;
  size_ty sStack_40;
  size_ty local_38;
  type local_28;
  type tStack_20;
  
  bVar1 = *(size_ty *)
           ((long)&(cc->
                   super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
                   ).
                   super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
                   .args_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
           + 0x10) == 0;
  bVar2 = *(size_ty *)
           ((long)&(cc->
                   super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
                   ).
                   super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
                   .args_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U> + 0x10) == 0;
  if (bVar1 && bVar2) {
    local_48 = (ptr)0x0;
    sStack_40 = 0;
    local_38 = 0;
    QuadAndLinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
              ((longdouble *)
               &(cc->
                super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
                ).
                super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
                .args_.super_QuadAndLinTerms,(QuadAndLinTerms *)&stack0xffffffffffffffb8,
               (vector<double,_std::allocator<double>_> *)prepro);
    local_28 = (type)((-(ulong)((double)in_ST0 <
                               (cc->
                               super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
                               ).
                               super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>_>
                               .args_.super_AlgConRhs<_2>.rhs_) >> 0x20 & 0x3ff00000) << 0x20);
    if (local_48 != (ptr)0x0) {
      tStack_20 = (type)0x0;
      operator_delete(local_48,local_38 - (long)local_48);
    }
    uVar3 = -(ulong)(prepro->lb_ < (double)local_28);
    uVar4 = -(ulong)((double)local_28 < prepro->ub_);
    prepro->lb_ = (double)(~uVar3 & (ulong)prepro->lb_ | (ulong)local_28 & uVar3);
    prepro->ub_ = (double)(~uVar4 & (ulong)prepro->ub_ | (ulong)local_28 & uVar4);
  }
  return bVar1 && bVar2;
}

Assistant:

bool CheckEmptySubCon(
      const ConditionalConstraint<SubCon>& cc,
      PreprocessInfo& prepro) {
    if (cc.GetConstraint().empty()) {
#ifndef NDEBUG
      MPD(AddWarning("empty_cmp",
                     "Empty comparison in a logical constraint\n  of type '"
                     + std::string(cc.GetTypeName())
                     + "'.\n  Please contact AMPL support."));
#endif
      auto res = ComputeValue(cc, std::vector<double>{});
      prepro.narrow_result_bounds(res, res);
      return true;
    }
    return false;
  }